

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O3

float * __thiscall sisl::cartesian_cubic<float>::operator()(cartesian_cubic<float> *this,int d0,...)

{
  float *pfVar1;
  uint in_ECX;
  uint in_EDX;
  va_list vl;
  
  pfVar1 = &this->__zero;
  this->__zero = 0.0;
  if ((((-1 < d0) && ((uint)d0 <= this->_nx)) && (-1 < (int)in_EDX)) &&
     (((in_EDX <= this->_ny && (-1 < (int)in_ECX)) && (in_ECX <= this->_nz)))) {
    pfVar1 = array_n<float,_3,_std::allocator<float>_>::operator()(&this->_array,d0);
  }
  return pfVar1;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0; va_list vl;
            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;


            if(!in_bound(_x,_y, _z)) return __zero;
            return _array(_x, _y, _z);
        }